

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  void *pvVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  size_t sVar4;
  mz_uint8 *pOut_buf_start;
  size_t sVar5;
  mz_ulong mVar6;
  mz_uint8 *ptr;
  ulong uVar7;
  long lVar8;
  mz_uint64 mVar9;
  mz_uint64 mVar10;
  ulong uVar11;
  mz_uint8 *pOut_buf_next;
  bool bVar12;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  mz_uint64 local_2df8;
  ulong local_2df0;
  mz_uint64 local_2dd0;
  size_t local_2db0;
  size_t local_2da8;
  ulong local_2da0;
  int local_2d98 [6];
  ushort local_2d7e;
  ushort local_2d7c;
  mz_zip_archive_file_stat local_2d70;
  tinfl_decompressor local_2b28;
  
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_2d70);
  if (mVar2 != 0) {
    bVar12 = true;
    if ((local_2d70.m_comp_size == 0) ||
       (mVar2 = mz_zip_reader_is_file_a_directory(pZip,file_index), mVar2 != 0)) goto LAB_00194423;
    if ((((byte)local_2d70.m_bit_flag & 0x21) == 0) &&
       (((((flags >> 10 & 1) != 0 || ((local_2d70.m_method & 0xfff7) == 0)) &&
         (sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2d70.m_local_header_ofs,local_2d98,0x1e)
         , sVar4 == 0x1e)) && (local_2d98[0] == 0x4034b50)))) {
      if (local_2d70.m_local_header_ofs + local_2d7e + (ulong)local_2d7c + local_2d70.m_comp_size +
          0x1e <= pZip->m_archive_size) {
        local_2dd0 = (ulong)local_2d7c + local_2d70.m_local_header_ofs + local_2d7e + 0x1e;
        pvVar1 = pZip->m_pState->m_pMem;
        mVar10 = local_2d70.m_comp_size;
        if (pvVar1 == (void *)0x0) {
          if (0xffff < local_2d70.m_comp_size) {
            mVar10 = 0x10000;
          }
          ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,mVar10);
          if (ptr == (mz_uint8 *)0x0) goto LAB_00194420;
          mVar9 = 0;
          uVar7 = local_2d70.m_comp_size;
        }
        else {
          ptr = (mz_uint8 *)((long)pvVar1 + local_2dd0);
          mVar9 = local_2d70.m_comp_size;
          uVar7 = 0;
        }
        if (((flags >> 10 & 1) == 0) && (local_2d70.m_method != 0)) {
          local_2b28.m_state = 0;
          pOut_buf_start = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
          if (pOut_buf_start == (mz_uint8 *)0x0) {
            local_2df0._0_4_ = 0;
            local_2df8 = 0;
            bVar12 = false;
          }
          else {
            local_2df0 = 0;
            lVar8 = 0;
            local_2df8 = 0;
            do {
              uVar11 = (ulong)((uint)local_2df8 & 0x7fff);
              local_2db0 = 0x8000 - uVar11;
              if (mVar9 == 0) {
                if (pZip->m_pState->m_pMem != (void *)0x0) {
                  mVar9 = 0;
                  goto LAB_00194577;
                }
                mVar9 = uVar7;
                if (mVar10 < uVar7) {
                  mVar9 = mVar10;
                }
                sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2dd0,ptr,mVar9);
                if (sVar4 == mVar9) {
                  local_2dd0 = local_2dd0 + mVar9;
                  uVar7 = uVar7 - mVar9;
                  lVar8 = 0;
                  goto LAB_00194577;
                }
                tVar3 = TINFL_STATUS_FAILED;
                bVar12 = false;
              }
              else {
LAB_00194577:
                pOut_buf_next = pOut_buf_start + uVar11;
                local_2da8 = mVar9;
                tVar3 = tinfl_decompress(&local_2b28,ptr + lVar8,&local_2da8,pOut_buf_start,
                                         pOut_buf_next,&local_2db0,(uint)(uVar7 != 0) * 2);
                sVar4 = local_2db0;
                mVar9 = mVar9 - local_2da8;
                lVar8 = local_2da8 + lVar8;
                if (local_2db0 == 0) {
                  bVar12 = true;
                }
                else {
                  local_2da0 = (ulong)(uint)tVar3;
                  sVar5 = (*pCallback)(pOpaque,local_2df8,pOut_buf_next,local_2db0);
                  if (sVar5 == sVar4) {
                    local_2df0 = mz_crc32(local_2df0 & 0xffffffff,pOut_buf_next,sVar4);
                    local_2df8 = local_2df8 + sVar4;
                    bVar12 = local_2df8 <= local_2d70.m_uncomp_size;
                    tVar3 = (tinfl_status)local_2da0;
                    if (local_2d70.m_uncomp_size < local_2df8) {
                      tVar3 = TINFL_STATUS_FAILED;
                    }
                  }
                  else {
                    tVar3 = TINFL_STATUS_FAILED;
                    bVar12 = false;
                  }
                }
              }
            } while ((bVar12) && ((uint)(tVar3 + TINFL_STATUS_FAILED) < 2));
            bVar12 = tVar3 == TINFL_STATUS_DONE;
          }
        }
        else if (pZip->m_pState->m_pMem == (void *)0x0) {
          bVar12 = true;
          if (uVar7 == 0) {
            local_2df0._0_4_ = 0;
            local_2df8 = 0;
            pOut_buf_start = (mz_uint8 *)0x0;
          }
          else {
            local_2df8 = 0;
            local_2df0 = 0;
            do {
              uVar11 = uVar7;
              if (mVar10 < uVar7) {
                uVar11 = mVar10;
              }
              sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2dd0,ptr,uVar11);
              if (sVar4 != uVar11) {
LAB_001947c1:
                bVar12 = false;
                break;
              }
              if ((flags >> 10 & 1) == 0) {
                local_2df0 = mz_crc32(local_2df0 & 0xffffffff,ptr,uVar11);
              }
              sVar4 = (*pCallback)(pOpaque,local_2df8,ptr,uVar11);
              if (sVar4 != uVar11) goto LAB_001947c1;
              local_2dd0 = local_2dd0 + uVar11;
              local_2df8 = local_2df8 + uVar11;
              uVar7 = uVar7 - uVar11;
            } while (uVar7 != 0);
            pOut_buf_start = (mz_uint8 *)0x0;
          }
        }
        else {
          sVar4 = (*pCallback)(pOpaque,0,ptr,local_2d70.m_comp_size);
          bVar12 = sVar4 == local_2d70.m_comp_size;
          local_2df8 = local_2d70.m_comp_size;
          if (((flags >> 10 & 1) == 0) && (sVar4 == local_2d70.m_comp_size)) {
            pOut_buf_start = (mz_uint8 *)0x0;
            mVar6 = mz_crc32(0,ptr,local_2d70.m_comp_size);
            local_2df0._0_4_ = (mz_uint32)mVar6;
            bVar12 = true;
          }
          else {
            pOut_buf_start = (mz_uint8 *)0x0;
            local_2df0._0_4_ = 0;
          }
        }
        if (((flags >> 10 & 1) == 0) && (bVar12 != false)) {
          bVar12 = (mz_uint32)local_2df0 == local_2d70.m_crc32 &&
                   local_2df8 == local_2d70.m_uncomp_size;
        }
        if (pZip->m_pState->m_pMem == (void *)0x0) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
        }
        if (pOut_buf_start != (mz_uint8 *)0x0) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pOut_buf_start);
        }
        goto LAB_00194423;
      }
    }
  }
LAB_00194420:
  bVar12 = false;
LAB_00194423:
  return (mz_bool)bVar12;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip,
                                          mz_uint file_index,
                                          mz_file_write_func pCallback,
                                          void *pOpaque, mz_uint flags) {
  int status = TINFL_STATUS_DONE;
  mz_uint file_crc32 = MZ_CRC32_INIT;
  mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining,
                           out_buf_ofs = 0, cur_file_ofs;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf = NULL;
  void *pWrite_buf = NULL;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  // Decompress the file either directly from memory or from a file input
  // buffer.
  if (pZip->m_pState->m_pMem) {
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else {
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pState->m_pMem) {
#ifdef _MSC_VER
      if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > 0xFFFFFFFF))
#else
      if (((sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > 0xFFFFFFFF))
#endif
        return MZ_FALSE;
      if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                    (size_t)file_stat.m_comp_size) != file_stat.m_comp_size)
        status = TINFL_STATUS_FAILED;
      else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
        file_crc32 =
            (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf,
                                (size_t)file_stat.m_comp_size);
      cur_file_ofs += file_stat.m_comp_size;
      out_buf_ofs += file_stat.m_comp_size;
      comp_remaining = 0;
    } else {
      while (comp_remaining) {
        read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                          (size_t)read_buf_avail) != read_buf_avail) {
          status = TINFL_STATUS_FAILED;
          break;
        }

        if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
          file_crc32 = (mz_uint32)mz_crc32(
              file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);

        if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                      (size_t)read_buf_avail) != read_buf_avail) {
          status = TINFL_STATUS_FAILED;
          break;
        }
        cur_file_ofs += read_buf_avail;
        out_buf_ofs += read_buf_avail;
        comp_remaining -= read_buf_avail;
      }
    }
  } else {
    tinfl_decompressor inflator;
    tinfl_init(&inflator);

    if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                             TINFL_LZ_DICT_SIZE)))
      status = TINFL_STATUS_FAILED;
    else {
      do {
        mz_uint8 *pWrite_buf_cur =
            (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        size_t in_buf_size,
            out_buf_size =
                TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
          read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
          if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                            (size_t)read_buf_avail) != read_buf_avail) {
            status = TINFL_STATUS_FAILED;
            break;
          }
          cur_file_ofs += read_buf_avail;
          comp_remaining -= read_buf_avail;
          read_buf_ofs = 0;
        }

        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(
            &inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
            (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size,
            comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;

        if (out_buf_size) {
          if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) !=
              out_buf_size) {
            status = TINFL_STATUS_FAILED;
            break;
          }
          file_crc32 =
              (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
          if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
            status = TINFL_STATUS_FAILED;
            break;
          }
        }
      } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) ||
               (status == TINFL_STATUS_HAS_MORE_OUTPUT));
    }
  }

  if ((status == TINFL_STATUS_DONE) &&
      (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (file_crc32 != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if (!pZip->m_pState->m_pMem)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  if (pWrite_buf)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

  return status == TINFL_STATUS_DONE;
}